

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O2

KDataStream * __thiscall KDIS::KDataStream::operator<<(KDataStream *this,KDataStream *val)

{
  pointer puVar1;
  pointer __x;
  
  puVar1 = (val->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__x = (val->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start; __x != puVar1; __x = __x + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vBuffer,__x);
  }
  return this;
}

Assistant:

KDataStream & KDataStream::operator << ( KDataStream val )
{
    vector<KUOCTET>::const_iterator citr = val.m_vBuffer.begin();
    vector<KUOCTET>::const_iterator citrEnd = val.m_vBuffer.end();

    // Copy data into the buffer OCTET by OCTET
    for( ; citr != citrEnd; ++citr )
    {
        m_vBuffer.push_back( *citr );
    }

    return *this;
}